

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg5s.hpp
# Opt level: O2

void __thiscall trng::mrg5s::jump2(mrg5s *this,uint s)

{
  uint uVar1;
  int32_t (*a) [25];
  result_type d [5];
  result_type c [25];
  int32_t local_148 [2];
  int32_t aiStack_140 [2];
  int local_138;
  int32_t local_128 [2];
  int32_t aiStack_120 [2];
  int local_118;
  int32_t local_108 [28];
  int32_t local_98 [2];
  int32_t aiStack_90 [2];
  int local_88;
  int32_t local_84;
  int32_t local_80 [22];
  
  local_98 = *(int32_t (*) [2])(this->P).a;
  aiStack_90 = *(int32_t (*) [2])((this->P).a + 2);
  local_88 = (this->P).a[4];
  local_84 = 1;
  local_80[0] = 0;
  local_80[1] = 0;
  local_80[2] = 0;
  local_80[3] = 0;
  local_80[4] = 0;
  local_80[5] = 1;
  local_80[6] = 0;
  local_80[7] = 0;
  local_80[8] = 0;
  local_80[9] = 0;
  local_80[10] = 0;
  local_80[0xb] = 1;
  local_80[0x10] = 0;
  local_80[0xc] = 0;
  local_80[0xd] = 0;
  local_80[0xe] = 0;
  local_80[0xf] = 0;
  local_80[0x11] = 1;
  local_80[0x12] = 0;
  for (uVar1 = 0; uVar1 < s; uVar1 = uVar1 + 2) {
    int_math::matrix_mult<5>
              ((int32_t (*) [25])local_98,(int32_t (*) [25])local_98,(int32_t (*) [25])local_108,
               0x7fffa78f);
    if (s <= uVar1 + 1) break;
    int_math::matrix_mult<5>
              ((int32_t (*) [25])local_108,(int32_t (*) [25])local_108,(int32_t (*) [25])local_98,
               0x7fffa78f);
  }
  local_128 = *(int32_t (*) [2])(this->S).r;
  aiStack_120 = *(int32_t (*) [2])((this->S).r + 2);
  local_118 = (this->S).r[4];
  a = (int32_t (*) [25])local_108;
  if ((s & 1) == 0) {
    a = (int32_t (*) [25])local_98;
  }
  int_math::matrix_vec_mult<5>(a,(int32_t (*) [5])local_128,(int32_t (*) [5])local_148,0x7fffa78f);
  *(int32_t (*) [2])(this->S).r = local_148;
  *(int32_t (*) [2])((this->S).r + 2) = aiStack_140;
  (this->S).r[4] = local_138;
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void mrg5s::jump2(unsigned int s) {
    result_type b[25], c[25];
    b[0] = P.a[0];
    b[1] = P.a[1];
    b[2] = P.a[2];
    b[3] = P.a[3];
    b[4] = P.a[4];
    b[5] = 1;
    b[6] = 0;
    b[7] = 0;
    b[8] = 0;
    b[9] = 0;
    b[10] = 0;
    b[11] = 1;
    b[12] = 0;
    b[13] = 0;
    b[14] = 0;
    b[15] = 0;
    b[16] = 0;
    b[17] = 1;
    b[18] = 0;
    b[19] = 0;
    b[20] = 0;
    b[21] = 0;
    b[22] = 0;
    b[23] = 1;
    b[24] = 0;
    for (unsigned int i{0}; i < s; ++i) {
      int_math::matrix_mult<5>(b, b, c, modulus);
      ++i;
      if (not(i < s))
        break;
      int_math::matrix_mult<5>(c, c, b, modulus);
    }
    const result_type r[5]{S.r[0], S.r[1], S.r[2], S.r[3], S.r[4]};
    result_type d[5];
    if ((s & 1u) == 0)
      int_math::matrix_vec_mult<5>(b, r, d, modulus);
    else
      int_math::matrix_vec_mult<5>(c, r, d, modulus);
    S.r[0] = d[0];
    S.r[1] = d[1];
    S.r[2] = d[2];
    S.r[3] = d[3];
    S.r[4] = d[4];
  }